

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::keypoint_localization_and_filtering(Surf *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 auStack_58 [7];
  bool solve_good;
  Keypoint kp;
  ulong local_40;
  size_t i;
  undefined1 local_28 [8];
  Keypoints filtered_keypoints;
  Surf *this_local;
  
  filtered_keypoints.
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::vector
            ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)local_28
            );
  sVar2 = std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::size
                    (&this->keypoints);
  std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::reserve
            ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)local_28
             ,sVar2);
  for (local_40 = 0;
      sVar2 = std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::size
                        (&this->keypoints), local_40 < sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::
             operator[](&this->keypoints,local_40);
    auStack_58._0_4_ = pvVar3->octave;
    unique0x100000d1 = pvVar3->sample;
    kp.octave = (int)pvVar3->x;
    kp.sample = pvVar3->y;
    bVar1 = keypoint_localization(this,(Keypoint *)auStack_58);
    if (bVar1) {
      std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::push_back
                ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)
                 local_28,(value_type *)auStack_58);
    }
  }
  std::swap<features::Surf::Keypoint,std::allocator<features::Surf::Keypoint>>
            (&this->keypoints,
             (vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)local_28
            );
  std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::~vector
            ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)local_28
            );
  return;
}

Assistant:

void
Surf::keypoint_localization_and_filtering (void)
{
    Keypoints filtered_keypoints;
    filtered_keypoints.reserve(this->keypoints.size());
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint kp = this->keypoints[i];
        bool solve_good = this->keypoint_localization(&kp);
        if (!solve_good)
            continue;
        filtered_keypoints.push_back(kp);
    }
    std::swap(this->keypoints, filtered_keypoints);
}